

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DisposeIntersectNodes(Clipper *this)

{
  size_type sVar1;
  reference ppIVar2;
  ulong local_18;
  size_t i;
  Clipper *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::
            size(&this->m_IntersectList);
    if (sVar1 <= local_18) break;
    ppIVar2 = std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
              ::operator[](&this->m_IntersectList,local_18);
    if (*ppIVar2 != (value_type)0x0) {
      operator_delete(*ppIVar2,0x20);
    }
    local_18 = local_18 + 1;
  }
  std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::clear
            (&this->m_IntersectList);
  return;
}

Assistant:

void Clipper::DisposeIntersectNodes()
{
  for (size_t i = 0; i < m_IntersectList.size(); ++i )
    delete m_IntersectList[i];
  m_IntersectList.clear();
}